

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void freeimage(Image *image)

{
  freebuffer(image);
  png_image_free(&image->image);
  if ((FILE *)image->input_file != (FILE *)0x0) {
    fclose((FILE *)image->input_file);
    image->input_file = (FILE *)0x0;
  }
  if (image->input_memory != (void *)0x0) {
    free(image->input_memory);
    image->input_memory = (png_voidp)0x0;
    image->input_memory_size = 0;
  }
  if ((image->tmpfile_name[0] != '\0') && ((image->opts & 0x10) == 0)) {
    remove(image->tmpfile_name);
    image->tmpfile_name[0] = '\0';
  }
  return;
}

Assistant:

static void
freeimage(Image *image)
{
   freebuffer(image);
   png_image_free(&image->image);

   if (image->input_file != NULL)
   {
      fclose(image->input_file);
      image->input_file = NULL;
   }

   if (image->input_memory != NULL)
   {
      free(image->input_memory);
      image->input_memory = NULL;
      image->input_memory_size = 0;
   }

   if (image->tmpfile_name[0] != 0 && (image->opts & KEEP_TMPFILES) == 0)
   {
      (void)remove(image->tmpfile_name);
      image->tmpfile_name[0] = 0;
   }
}